

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O2

int re_parse_disjunction(REParseState *s,BOOL is_backward_dir)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = lre_check_stack_overflow(s->opaque,0);
  if (iVar2 == 0) {
    sVar1 = (s->byte_code).size;
    iVar3 = re_parse_alternative(s,is_backward_dir);
    iVar2 = -1;
    if (iVar3 == 0) {
      iVar2 = (int)sVar1;
      while (*s->buf_ptr == '|') {
        s->buf_ptr = s->buf_ptr + 1;
        sVar1 = (s->byte_code).size;
        iVar3 = dbuf_insert(&s->byte_code,iVar2,5);
        if (iVar3 != 0) {
          re_parse_out_of_memory(s);
          return -1;
        }
        (s->byte_code).buf[iVar2] = '\t';
        *(int *)((s->byte_code).buf + (long)iVar2 + 1) = ((int)sVar1 - iVar2) + 5;
        iVar3 = re_emit_op_u32(s,7,0);
        iVar4 = re_parse_alternative(s,is_backward_dir);
        if (iVar4 != 0) {
          return -1;
        }
        *(int *)((s->byte_code).buf + iVar3) = ((int)(s->byte_code).size - iVar3) + -4;
      }
      iVar2 = 0;
    }
  }
  else {
    re_parse_error(s,"stack overflow");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int re_parse_disjunction(REParseState *s, BOOL is_backward_dir)
{
    int start, len, pos;

    if (lre_check_stack_overflow(s->opaque, 0))
        return re_parse_error(s, "stack overflow");
    
    start = s->byte_code.size;
    if (re_parse_alternative(s, is_backward_dir))
        return -1;
    while (*s->buf_ptr == '|') {
        s->buf_ptr++;

        len = s->byte_code.size - start;

        /* insert a split before the first alternative */
        if (dbuf_insert(&s->byte_code, start, 5)) {
            return re_parse_out_of_memory(s);
        }
        s->byte_code.buf[start] = REOP_split_next_first;
        put_u32(s->byte_code.buf + start + 1, len + 5);

        pos = re_emit_op_u32(s, REOP_goto, 0);

        if (re_parse_alternative(s, is_backward_dir))
            return -1;
        
        /* patch the goto */
        len = s->byte_code.size - (pos + 4);
        put_u32(s->byte_code.buf + pos, len);
    }
    return 0;
}